

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O2

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::ReleaseMessage
          (ExtensionSet *this,FieldDescriptor *descriptor,MessageFactory *factory)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar1;
  int iVar2;
  Extension *pEVar3;
  LogMessage *pLVar4;
  MessageLite *pMVar5;
  Descriptor *pDVar6;
  LogMessage local_70;
  LogFinisher local_31;
  
  pEVar3 = FindOrNull(this,*(int *)(descriptor + 0x44));
  if (pEVar3 == (Extension *)0x0) {
    pMVar5 = (MessageLite *)0x0;
  }
  else {
    if (pEVar3->is_repeated == true) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/extension_set_heavy.cc"
                 ,200);
      pLVar4 = LogMessage::operator<<
                         (&local_70,
                          "CHECK failed: ((*extension).is_repeated ? FieldDescriptor::LABEL_REPEATED : FieldDescriptor::LABEL_OPTIONAL) == (FieldDescriptor::LABEL_OPTIONAL): "
                         );
      LogFinisher::operator=(&local_31,pLVar4);
      LogMessage::~LogMessage(&local_70);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pEVar3->type * 4) != 10) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/extension_set_heavy.cc"
                 ,200);
      pLVar4 = LogMessage::operator<<
                         (&local_70,
                          "CHECK failed: (cpp_type((*extension).type)) == (FieldDescriptor::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_31,pLVar4);
      LogMessage::~LogMessage(&local_70);
    }
    if ((pEVar3->field_0xa & 0x10) == 0) {
      pMVar5 = (MessageLite *)(pEVar3->field_0).repeated_string_value;
      if (this->arena_ != (Arena *)0x0) {
        pMVar5 = (MessageLite *)
                 (*(code *)(((RepeatedPtrFieldBase *)&pMVar5->_vptr_MessageLite)->arena_->impl_).
                           initial_block_)(pMVar5);
        (*(code *)(((RepeatedPtrFieldBase *)&pMVar5->_vptr_MessageLite)->arena_->impl_).options_.
                  initial_block_size)(pMVar5,(pEVar3->field_0).int64_value);
      }
    }
    else {
      pRVar1 = (pEVar3->field_0).repeated_string_value;
      pDVar6 = FieldDescriptor::message_type(descriptor);
      iVar2 = (*factory->_vptr_MessageFactory[2])(factory,pDVar6);
      pMVar5 = (MessageLite *)
               (*(code *)(((pRVar1->super_RepeatedPtrFieldBase).arena_)->impl_).options_.
                         initial_block)(pRVar1,iVar2);
      if ((this->arena_ == (Arena *)0x0) &&
         ((pEVar3->field_0).repeated_string_value !=
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x0)) {
        (*(code *)(((((pEVar3->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).arena_)
                  ->impl_).hint_._M_b._M_p)();
      }
    }
    Erase(this,*(int *)(descriptor + 0x44));
  }
  return pMVar5;
}

Assistant:

MessageLite* ExtensionSet::ReleaseMessage(const FieldDescriptor* descriptor,
                                          MessageFactory* factory) {
  Extension* extension = FindOrNull(descriptor->number());
  if (extension == NULL) {
    // Not present.  Return NULL.
    return NULL;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL, MESSAGE);
    MessageLite* ret = NULL;
    if (extension->is_lazy) {
      ret = extension->lazymessage_value->ReleaseMessage(
          *factory->GetPrototype(descriptor->message_type()));
      if (arena_ == NULL) {
        delete extension->lazymessage_value;
      }
    } else {
      if (arena_ != NULL) {
        ret = extension->message_value->New();
        ret->CheckTypeAndMergeFrom(*extension->message_value);
      } else {
        ret = extension->message_value;
      }
    }
    Erase(descriptor->number());
    return ret;
  }
}